

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_uints(Impl *this,Value *uints,uint32_t **out_uints)

{
  SizeType SVar1;
  uint uVar2;
  uint *puVar3;
  ConstValueIterator pGVar4;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *local_38;
  ConstValueIterator itr;
  uint *ret;
  uint *u32s;
  uint32_t **out_uints_local;
  Value *uints_local;
  Impl *this_local;
  
  SVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Size(uints);
  puVar3 = ScratchAllocator::allocate_n<unsigned_int>(&this->allocator,(ulong)SVar1);
  local_38 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::Begin(uints);
  ret = puVar3;
  while( true ) {
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::End(uints);
    if (local_38 == pGVar4) break;
    uVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(local_38);
    *ret = uVar2;
    local_38 = local_38 + 1;
    ret = ret + 1;
  }
  *out_uints = puVar3;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_uints(const Value &uints, const uint32_t **out_uints)
{
	auto *u32s = allocator.allocate_n<uint32_t>(uints.Size());
	auto *ret = u32s;
	for (auto itr = uints.Begin(); itr != uints.End(); ++itr, u32s++)
		*u32s = itr->GetUint();

	*out_uints = ret;
	return true;
}